

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_promise_executor(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic,
                           JSValue *func_data)

{
  int *piVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  long lVar4;
  ulong uVar5;
  
  lVar4 = 0;
  uVar5 = 3;
  do {
    if (lVar4 == 0x20) {
LAB_0013be3f:
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar5;
      return (JSValue)(auVar3 << 0x40);
    }
    if (*(int *)((long)&func_data->tag + lVar4) != 3) {
      JS_ThrowTypeError(ctx,"resolving function already set");
      uVar5 = 6;
      goto LAB_0013be3f;
    }
    piVar1 = *(int **)((long)&argv->u + lVar4);
    uVar2 = *(undefined8 *)((long)&argv->tag + lVar4);
    if (0xfffffff4 < (uint)uVar2) {
      *piVar1 = *piVar1 + 1;
    }
    *(int **)((long)&func_data->u + lVar4) = piVar1;
    *(undefined8 *)((long)&func_data->tag + lVar4) = uVar2;
    lVar4 = lVar4 + 0x10;
  } while( true );
}

Assistant:

static JSValue js_promise_executor(JSContext *ctx,
                                   JSValueConst this_val,
                                   int argc, JSValueConst *argv,
                                   int magic, JSValue *func_data)
{
    int i;

    for(i = 0; i < 2; i++) {
        if (!JS_IsUndefined(func_data[i]))
            return JS_ThrowTypeError(ctx, "resolving function already set");
        func_data[i] = JS_DupValue(ctx, argv[i]);
    }
    return JS_UNDEFINED;
}